

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  bool bVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar4;
  bool local_91;
  Extension *local_90;
  anon_union_8_9_fdc4a54a_for_Extension_0 local_88;
  undefined8 local_80;
  FieldDescriptor *local_78;
  bool local_59;
  Extension *local_58;
  int local_4c;
  KeyValue *pKStack_48;
  int map_key;
  KeyValue *flat;
  uint16_t i;
  int local_24;
  ExtensionSet *pEStack_20;
  int key_local;
  ExtensionSet *this_local;
  bool local_10;
  
  local_24 = key;
  pEStack_20 = this;
  bVar2 = is_large(this);
  if (bVar2) {
    pVar3 = InternalInsertIntoLargeMap(this,local_24);
    local_10 = pVar3.second;
  }
  else {
    pKStack_48 = (this->map_).flat;
    for (flat._6_2_ = this->flat_size_; flat._6_2_ != 0; flat._6_2_ = flat._6_2_ - 1) {
      local_4c = pKStack_48[(int)(flat._6_2_ - 1)].first;
      if (local_4c == local_24) {
        local_58 = &pKStack_48[(int)(flat._6_2_ - 1)].second;
        local_59 = false;
        std::pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool>::
        pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool,_true>
                  ((pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> *)&this_local,
                   &local_58,&local_59);
        pVar3._8_8_ = extraout_RDX;
        pVar3.first = (Extension *)this_local;
        goto LAB_004326b2;
      }
      if (local_4c < local_24) break;
    }
    if (this->flat_size_ == this->flat_capacity_) {
      GrowCapacity(this,(long)(int)(this->flat_size_ + 1));
      bVar2 = is_large(this);
      if (bVar2) {
        pVar3 = InternalInsertIntoLargeMap(this,local_24);
        local_10 = pVar3.second;
        goto LAB_004326b2;
      }
      pKStack_48 = (this->map_).flat;
    }
    std::
    copy_backward<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
              (pKStack_48 + (int)(uint)flat._6_2_,pKStack_48 + (int)(uint)this->flat_size_,
               pKStack_48 + (long)(int)(uint)this->flat_size_ + 1);
    this->flat_size_ = this->flat_size_ + 1;
    pKStack_48[flat._6_2_].first = local_24;
    memset(&local_88,0,0x18);
    pKStack_48[flat._6_2_].second.field_0 = local_88;
    pKVar1 = pKStack_48 + flat._6_2_;
    (pKVar1->second).type = (undefined1)local_80;
    (pKVar1->second).is_repeated = (bool)local_80._1_1_;
    (pKVar1->second).field_0xa = local_80._2_1_;
    (pKVar1->second).is_packed = (bool)local_80._3_1_;
    (pKVar1->second).cached_size = (TrivialAtomicInt)local_80._4_4_;
    pKStack_48[flat._6_2_].second.descriptor = local_78;
    local_90 = &pKStack_48[flat._6_2_].second;
    local_91 = true;
    std::pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool>::
    pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool,_true>
              ((pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> *)&this_local,
               &local_90,&local_91);
    pVar3._8_8_ = extraout_RDX_00;
    pVar3.first = (Extension *)this_local;
  }
LAB_004326b2:
  this_local = (ExtensionSet *)pVar3.first;
  pVar4._9_7_ = pVar3._9_7_;
  pVar4.second = local_10;
  pVar4.first = (Extension *)this_local;
  return pVar4;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return InternalInsertIntoLargeMap(key);
  }
  uint16_t i = flat_size_;
  KeyValue* flat = map_.flat;
  // Iterating from the back to benefit the case where the keys are inserted in
  // increasing order.
  for (; i > 0; --i) {
    int map_key = flat[i - 1].first;
    if (map_key == key) {
      return {&flat[i - 1].second, false};
    }
    if (map_key < key) {
      break;
    }
  }
  if (flat_size_ == flat_capacity_) {
    GrowCapacity(flat_size_ + 1);
    if (ABSL_PREDICT_FALSE(is_large())) {
      return InternalInsertIntoLargeMap(key);
    }
    flat = map_.flat;  // Reload flat pointer after GrowCapacity.
  }

  std::copy_backward(flat + i, flat + flat_size_, flat + flat_size_ + 1);
  ++flat_size_;
  flat[i].first = key;
  flat[i].second = Extension();
  return {&flat[i].second, true};
}